

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O1

void * Curl_hash_add2(Curl_hash *h,void *key,size_t key_len,void *p,Curl_hash_elem_dtor dtor)

{
  size_t sVar1;
  Curl_llist_node *n;
  void *pvVar2;
  size_t sVar3;
  Curl_llist *pCVar4;
  long lVar5;
  ulong uVar6;
  
  if (h->table == (Curl_llist *)0x0) {
    pCVar4 = (Curl_llist *)(*Curl_cmalloc)(h->slots << 5);
    h->table = pCVar4;
    if (pCVar4 == (Curl_llist *)0x0) {
      return (void *)0x0;
    }
    if (h->slots != 0) {
      lVar5 = 0;
      uVar6 = 0;
      do {
        Curl_llist_init((Curl_llist *)((long)&h->table->_head + lVar5),hash_element_dtor);
        uVar6 = uVar6 + 1;
        lVar5 = lVar5 + 0x20;
      } while (uVar6 < h->slots);
    }
    if (pCVar4 == (Curl_llist *)0x0) {
      return (void *)0x0;
    }
  }
  pCVar4 = h->table;
  sVar1 = (*h->hash_func)(key,key_len,h->slots);
  n = Curl_llist_head(pCVar4 + sVar1);
  do {
    if (n == (Curl_llist_node *)0x0) {
LAB_0012ff09:
      pvVar2 = (*Curl_cmalloc)(key_len + 0x40);
      if (pvVar2 == (void *)0x0) {
        return (void *)0x0;
      }
      memcpy((void *)((long)pvVar2 + 0x38),key,key_len);
      *(size_t *)((long)pvVar2 + 0x30) = key_len;
      *(void **)((long)pvVar2 + 0x20) = p;
      *(Curl_hash_elem_dtor *)((long)pvVar2 + 0x28) = dtor;
      Curl_llist_append(pCVar4 + sVar1,pvVar2,(Curl_llist_node *)pvVar2);
      h->size = h->size + 1;
      return p;
    }
    pvVar2 = Curl_node_elem(n);
    sVar3 = (*h->comp_func)((void *)((long)pvVar2 + 0x38),*(size_t *)((long)pvVar2 + 0x30),key,
                            key_len);
    if (sVar3 != 0) {
      Curl_node_uremove(n,h);
      h->size = h->size - 1;
      goto LAB_0012ff09;
    }
    n = Curl_node_next(n);
  } while( true );
}

Assistant:

void *Curl_hash_add2(struct Curl_hash *h, void *key, size_t key_len, void *p,
                     Curl_hash_elem_dtor dtor)
{
  struct Curl_hash_element  *he;
  struct Curl_llist_node *le;
  struct Curl_llist *l;

  DEBUGASSERT(h);
  DEBUGASSERT(h->slots);
  DEBUGASSERT(h->init == HASHINIT);
  if(!h->table) {
    size_t i;
    h->table = malloc(h->slots * sizeof(struct Curl_llist));
    if(!h->table)
      return NULL; /* OOM */
    for(i = 0; i < h->slots; ++i)
      Curl_llist_init(&h->table[i], hash_element_dtor);
  }

  l = FETCH_LIST(h, key, key_len);

  for(le = Curl_llist_head(l); le; le = Curl_node_next(le)) {
    he = (struct Curl_hash_element *) Curl_node_elem(le);
    if(h->comp_func(he->key, he->key_len, key, key_len)) {
      Curl_node_uremove(le, (void *)h);
      --h->size;
      break;
    }
  }

  he = mk_hash_element(key, key_len, p, dtor);
  if(he) {
    Curl_llist_append(l, he, &he->list);
    ++h->size;
    return p; /* return the new entry */
  }

  return NULL; /* failure */
}